

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pr.cpp
# Opt level: O3

longlong tid_to_ll(id *tid)

{
  longlong lVar1;
  string local_30;
  
  tid_to_string_abi_cxx11_(&local_30,tid);
  lVar1 = atoll(local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return lVar1;
}

Assistant:

long long tid_to_ll(const thread::id& tid)
{
    return atoll(tid_to_string(tid).c_str());
}